

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FilePathSpecSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::FilePathSpecSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  FilePathSpecSyntax *pFVar6;
  
  pFVar6 = (FilePathSpecSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FilePathSpecSyntax *)this->endPtr < pFVar6 + 1) {
    pFVar6 = (FilePathSpecSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pFVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pFVar6->super_SyntaxNode).kind = FilePathSpec;
  (pFVar6->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pFVar6->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pFVar6->path).kind = TVar2;
  (pFVar6->path).field_0x2 = uVar3;
  (pFVar6->path).numFlags = (NumericTokenFlags)NVar4.raw;
  (pFVar6->path).rawLen = uVar5;
  (pFVar6->path).info = pIVar1;
  return pFVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }